

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

char * escape_string_for_regex(char *s)

{
  size_t sVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  
  sVar1 = strlen(s);
  pbVar2 = (byte *)malloc(sVar1 * 2 + 2);
  pbVar3 = pbVar2;
  do {
    uVar4 = (byte)*s - 0x28;
    if ((uVar4 < 0x37) && ((0x7800000080002fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
      *pbVar3 = 0x5c;
      pbVar3 = pbVar3 + 1;
    }
    else if (*s == 0) {
      *pbVar3 = 0;
      return (char *)pbVar2;
    }
    *pbVar3 = *s;
    pbVar3 = pbVar3 + 1;
    s = (char *)((byte *)s + 1);
  } while( true );
}

Assistant:

char *escape_string_for_regex(const char *s) {
  char *ss = (char *)MALLOC((strlen(s) + 1) * 2), *sss = ss;
  for (; *s; s++) {
    switch (*s) {
      case '(':
      case ')':
      case '[':
      case ']':
      case '-':
      case '^':
      case '*':
      case '?':
      case '+':
      case '\\':
        *ss++ = '\\';
        /* fall through */
      default:
        *ss++ = *s;
        break;
    }
  }
  *ss = 0;
  return sss;
}